

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall ON_SubDMeshFragment::Clear(ON_SubDMeshFragment *this)

{
  ushort uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_Color OVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  undefined8 uVar13;
  ON__UINT16 OVar14;
  ON__UINT32 OVar15;
  uint *puVar16;
  uint *puVar17;
  ON_SubDMeshFragmentGrid *pOVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  
  this->m_face_fragment_count = 0;
  this->m_face_fragment_index = 0;
  this->m_face = (ON_SubDFace *)0x0;
  this->m_face_vertex_index[0] = 0;
  this->m_face_vertex_index[1] = 0;
  this->m_face_vertex_index[2] = 0;
  this->m_face_vertex_index[3] = 0;
  this->m_vertex_count_etc = this->m_vertex_count_etc & 0xe000;
  ClearTextureCoordinates(this);
  uVar1 = this->m_vertex_capacity_etc;
  this->m_vertex_capacity_etc = uVar1 & 0xbfff;
  dVar2 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[0].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[0].k2 = dVar2;
  dVar2 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[1].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[1].k2 = dVar2;
  dVar2 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[2].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[2].k2 = dVar2;
  dVar2 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[3].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[3].k2 = dVar2;
  this->m_vertex_capacity_etc = uVar1 & 0x9fff;
  OVar7 = ON_Color::UnsetColor;
  this->m_ctrlnetC[0].field_0 = ON_Color::UnsetColor.field_0;
  this->m_ctrlnetC[1].field_0 = OVar7.field_0;
  this->m_ctrlnetC[2].field_0 = OVar7.field_0;
  this->m_ctrlnetC[3].field_0 = OVar7.field_0;
  ClearControlNetQuad(this);
  dVar2 = ON_DBL_QNAN;
  uVar21 = 0x150;
  do {
    *(double *)((long)this->m_face_vertex_index + (uVar21 - 8)) = dVar2;
    pOVar18 = ON_SubDMeshFragmentGrid::Empty.m_next_level_of_detail;
    puVar17 = ON_SubDMeshFragmentGrid::Empty.m_S;
    puVar16 = ON_SubDMeshFragmentGrid::Empty.m_F;
    uVar13 = ON_SubDMeshFragmentGrid::Empty._8_8_;
    uVar20 = ON_SubDMeshFragmentGrid::Empty._0_8_;
    uVar21 = uVar21 + 8;
  } while (uVar21 < 400);
  (this->m_grid).m_prev_level_of_detail = ON_SubDMeshFragmentGrid::Empty.m_prev_level_of_detail;
  (this->m_grid).m_next_level_of_detail = pOVar18;
  (this->m_grid).m_F = puVar16;
  (this->m_grid).m_S = puVar17;
  uVar19 = ON_SubDMeshFragmentGrid::Empty._0_8_;
  ON_SubDMeshFragmentGrid::Empty.m_reserved1 = (uchar)uVar20;
  ON_SubDMeshFragmentGrid::Empty.m_reserved2 = SUB81(uVar20,1);
  uVar8 = ON_SubDMeshFragmentGrid::Empty.m_reserved2;
  ON_SubDMeshFragmentGrid::Empty.m_side_segment_count = SUB81(uVar20,2);
  uVar9 = ON_SubDMeshFragmentGrid::Empty.m_side_segment_count;
  ON_SubDMeshFragmentGrid::Empty.m_reserved3 = SUB81(uVar20,3);
  uVar10 = ON_SubDMeshFragmentGrid::Empty.m_reserved3;
  ON_SubDMeshFragmentGrid::Empty.m_F_count = SUB82(uVar20,4);
  uVar11 = ON_SubDMeshFragmentGrid::Empty.m_F_count;
  ON_SubDMeshFragmentGrid::Empty.m_F_level_of_detail = SUB82(uVar20,6);
  uVar12 = ON_SubDMeshFragmentGrid::Empty.m_F_level_of_detail;
  (this->m_grid).m_reserved1 = ON_SubDMeshFragmentGrid::Empty.m_reserved1;
  ON_SubDMeshFragmentGrid::Empty._0_8_ = uVar19;
  uVar20 = ON_SubDMeshFragmentGrid::Empty._8_8_;
  (this->m_grid).m_reserved2 = uVar8;
  (this->m_grid).m_side_segment_count = uVar9;
  (this->m_grid).m_reserved3 = uVar10;
  (this->m_grid).m_F_count = uVar11;
  (this->m_grid).m_F_level_of_detail = uVar12;
  ON_SubDMeshFragmentGrid::Empty.m_F_stride = (unsigned_short)uVar13;
  ON_SubDMeshFragmentGrid::Empty.m_reserved4 = SUB82(uVar13,2);
  OVar14 = ON_SubDMeshFragmentGrid::Empty.m_reserved4;
  ON_SubDMeshFragmentGrid::Empty.m_reserved5 = SUB84(uVar13,4);
  OVar15 = ON_SubDMeshFragmentGrid::Empty.m_reserved5;
  (this->m_grid).m_F_stride = ON_SubDMeshFragmentGrid::Empty.m_F_stride;
  ON_SubDMeshFragmentGrid::Empty._8_8_ = uVar20;
  dVar6 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar5 = ON_BoundingBox::NanBoundingBox.m_max.y;
  dVar4 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar3 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar2 = ON_BoundingBox::NanBoundingBox.m_min.y;
  (this->m_grid).m_reserved4 = OVar14;
  (this->m_grid).m_reserved5 = OVar15;
  (this->m_surface_bbox).m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
  (this->m_surface_bbox).m_min.y = dVar2;
  (this->m_surface_bbox).m_min.z = dVar3;
  (this->m_surface_bbox).m_max.x = dVar4;
  (this->m_surface_bbox).m_max.y = dVar5;
  (this->m_surface_bbox).m_max.z = dVar6;
  return;
}

Assistant:

void ON_SubDMeshFragment::Clear() ON_NOEXCEPT
{
  m_face = nullptr;
  m_face_vertex_index[0] = 0;
  m_face_vertex_index[1] = 0;
  m_face_vertex_index[2] = 0;
  m_face_vertex_index[3] = 0;

  m_face_fragment_count = 0;
  m_face_fragment_index = 0;

  // This line sets vertex count = 0
  m_vertex_count_etc &= ON_SubDMeshFragment::EtcMask;

  // Do NOT change vertex capacity.
  // Do NOT delete managed arrays.
  // The point is to be able to clear and reuse a fragment.

  ClearTextureCoordinates();
  ClearCurvatures();
  ClearColors();
  ClearControlNetQuad();
  ClearPackRect();
  m_grid = ON_SubDMeshFragmentGrid::Empty;
  m_surface_bbox = ON_BoundingBox::NanBoundingBox;
}